

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O2

char * getrule(char *strp,rule *rulep)

{
  byte bVar1;
  char *pcVar2;
  int max;
  int min;
  
  bVar1 = *strp;
  if (bVar1 == 0x4d) {
    rulep->type = MONTH_NTH_DAY_OF_WEEK;
    pcVar2 = getnum(strp + 1,&rulep->mon,1,0xc);
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    if (*pcVar2 != '.') {
      return (char *)0x0;
    }
    pcVar2 = getnum(pcVar2 + 1,&rulep->week,1,5);
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    if (*pcVar2 != '.') {
      return (char *)0x0;
    }
    strp = pcVar2 + 1;
    max = 6;
    min = 0;
  }
  else {
    if (bVar1 == 0x4a) {
      rulep->type = JULIAN_DAY;
      strp = strp + 1;
      min = 1;
    }
    else {
      if (9 < bVar1 - 0x30) {
        return (char *)0x0;
      }
      rulep->type = DAY_OF_YEAR;
      min = 0;
    }
    max = 0x16d;
  }
  pcVar2 = getnum(strp,&rulep->day,min,max);
  if (pcVar2 == (char *)0x0) {
    return (char *)0x0;
  }
  if (*pcVar2 == '/') {
    pcVar2 = getoffset(pcVar2 + 1,&rulep->time);
    return pcVar2;
  }
  rulep->time = 0x1c20;
  return pcVar2;
}

Assistant:

static const char * getrule( const char * strp, struct rule * rulep )
{
    if ( *strp == 'J' )
    {
        /* Julian day. */
        rulep->type = JULIAN_DAY;
        ++strp;
        strp = getnum( strp, &rulep->day, 1, DAYSPERNYEAR );
    }
    else if ( *strp == 'M' )
    {
        /* Month, week, day. */
        rulep->type = MONTH_NTH_DAY_OF_WEEK;
        ++strp;
        strp = getnum( strp, &rulep->mon, 1, MONSPERYEAR );

        if ( strp == NULL )
        {
            return NULL;
        }

        if ( *strp++ != '.' )
        {
            return NULL;
        }

        strp = getnum( strp, &rulep->week, 1, 5 );

        if ( strp == NULL )
        {
            return NULL;
        }

        if ( *strp++ != '.' )
        {
            return NULL;
        }

        strp = getnum( strp, &rulep->day, 0, DAYSPERWEEK - 1 );
    }
    else if ( isdigit( (unsigned char)*strp ) )
    {
        /* Day of year. */
        rulep->type = DAY_OF_YEAR;
        strp = getnum( strp, &rulep->day, 0, DAYSPERLYEAR - 1 );
    }
    else
    {
        return NULL;        /* invalid format */
    }

    if ( strp == NULL )
    {
        return NULL;
    }

    if ( *strp == '/' )
    {
        /* Time specified. */
        ++strp;
        strp = getoffset( strp, &rulep->time );
    }
    else
    {
        rulep->time = 2 * SECSPERHOUR;    /* default = 2:00:00 */
    }

    return strp;
}